

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_node.c
# Opt level: O0

REF_STATUS ref_node_add_many(REF_NODE ref_node,REF_INT n,REF_GLOB *global_orig)

{
  uint uVar1;
  REF_GLOB *original;
  REF_INT *sorted_index;
  REF_STATUS ref_private_macro_code_rss_2;
  REF_STATUS ref_private_macro_code_rss_1;
  REF_STATUS ref_private_macro_code_rss;
  REF_INT *sorted;
  REF_GLOB *global;
  REF_INT local_38;
  REF_INT nadd;
  REF_INT local;
  REF_INT j;
  REF_INT i;
  REF_STATUS status;
  REF_GLOB *global_orig_local;
  REF_NODE pRStack_18;
  REF_INT n_local;
  REF_NODE ref_node_local;
  
  _i = global_orig;
  global_orig_local._4_4_ = n;
  pRStack_18 = ref_node;
  if (n < 0) {
    printf("%s: %d: %s: %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_node.c",0x179,
           "ref_node_add_many","malloc global of REF_GLOB negative");
    ref_node_local._4_4_ = 1;
  }
  else {
    original = (REF_GLOB *)malloc((long)n << 3);
    if (original == (REF_GLOB *)0x0) {
      printf("%s: %d: %s: %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_node.c",0x179,
             "ref_node_add_many","malloc global of REF_GLOB NULL");
      ref_node_local._4_4_ = 2;
    }
    else {
      global._4_4_ = 0;
      for (local = 0; local < global_orig_local._4_4_; local = local + 1) {
        j = ::ref_node_local(pRStack_18,_i[local],&local_38);
        if (j == 5) {
          original[global._4_4_] = _i[local];
          global._4_4_ = global._4_4_ + 1;
        }
      }
      if (global._4_4_ < 0) {
        printf("%s: %d: %s: %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_node.c",
               0x186,"ref_node_add_many","malloc sorted of REF_INT negative");
        ref_node_local._4_4_ = 1;
      }
      else {
        sorted_index = (REF_INT *)malloc((long)global._4_4_ << 2);
        if (sorted_index == (REF_INT *)0x0) {
          printf("%s: %d: %s: %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_node.c",
                 0x186,"ref_node_add_many","malloc sorted of REF_INT NULL");
          ref_node_local._4_4_ = 2;
        }
        else {
          uVar1 = ref_sort_heap_glob(global._4_4_,original,sorted_index);
          if (uVar1 == 0) {
            nadd = 0;
            for (local = 1; local < global._4_4_; local = local + 1) {
              if (original[sorted_index[local]] == original[sorted_index[nadd]]) {
                original[sorted_index[local]] = -1;
              }
              else {
                nadd = local;
              }
            }
            for (local = 0; local < global._4_4_; local = local + 1) {
              if ((original[local] != -1) &&
                 (uVar1 = ref_node_add_core(pRStack_18,original[local],&local_38), uVar1 != 0)) {
                printf("%s: %d: %s: %d %s\n",
                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_node.c"
                       ,0x197,"ref_node_add_many",(ulong)uVar1,"add core");
                return uVar1;
              }
            }
            uVar1 = ref_node_rebuild_sorted_global(pRStack_18);
            if (uVar1 == 0) {
              if (sorted_index != (REF_INT *)0x0) {
                free(sorted_index);
              }
              if (original != (REF_GLOB *)0x0) {
                free(original);
              }
              ref_node_local._4_4_ = 0;
            }
            else {
              printf("%s: %d: %s: %d %s\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_node.c"
                     ,0x19a,"ref_node_add_many",(ulong)uVar1,"rebuild globals");
              ref_node_local._4_4_ = uVar1;
            }
          }
          else {
            printf("%s: %d: %s: %d %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_node.c",
                   0x188,"ref_node_add_many",(ulong)uVar1,"heap");
            ref_node_local._4_4_ = uVar1;
          }
        }
      }
    }
  }
  return ref_node_local._4_4_;
}

Assistant:

REF_FCN REF_STATUS ref_node_add_many(REF_NODE ref_node, REF_INT n,
                                     REF_GLOB *global_orig) {
  REF_STATUS status;
  REF_INT i, j, local, nadd;

  REF_GLOB *global;
  REF_INT *sorted;

  /* copy, removing existing nodes from list */

  ref_malloc(global, n, REF_GLOB);

  nadd = 0;
  for (i = 0; i < n; i++) {
    status = ref_node_local(ref_node, global_orig[i], &local);
    if (REF_NOT_FOUND == status) {
      global[nadd] = global_orig[i];
      nadd++;
    }
  }

  /* remove duplicates from list so core add can be used with existing check */

  ref_malloc(sorted, nadd, REF_INT);

  RSS(ref_sort_heap_glob(nadd, global, sorted), "heap");

  j = 0;
  for (i = 1; i < nadd; i++) {
    if (global[sorted[i]] != global[sorted[j]]) {
      j = i;
      continue;
    }
    global[sorted[i]] = REF_EMPTY;
  }

  /* add remaining via core */

  for (i = 0; i < nadd; i++)
    if (REF_EMPTY != global[i]) {
      RSS(ref_node_add_core(ref_node, global[i], &local), "add core");
    }

  RSS(ref_node_rebuild_sorted_global(ref_node), "rebuild globals");

  ref_free(sorted);
  ref_free(global);

  return REF_SUCCESS;
}